

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

void henson_yield(void)

{
  context_t *pcVar1;
  
  pcVar1 = parent;
  if (local != (context_t *)0x0 && parent != (context_t *)0x0) {
    local->sp = (void **)&stack0xffffffffffffffd0;
    (*(code *)pcVar1->sp[6])();
    return;
  }
  return;
}

Assistant:

__attribute__ ((visibility ("hidden")))
void henson_yield()
{
    if (parent == 0 || local == 0)      // not running under henson; do nothing
        return;

#ifdef USE_BOOST
    *parent = parent->resume();
#else
    coro_transfer(local, parent);
#endif
}